

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

lua_Unsigned lua_rawlen(lua_State *L,int idx)

{
  TValue *pTVar1;
  lua_Unsigned lVar2;
  byte bVar3;
  
  pTVar1 = index2value(L,idx);
  bVar3 = pTVar1->tt_ & 0x3f;
  lVar2 = 0;
  if (bVar3 < 7) {
    if (bVar3 == 4) {
      lVar2 = (lua_Unsigned)(char)(pTVar1->value_).f[0xb];
    }
    else if (bVar3 == 5) {
      lVar2 = luaH_getn((Table *)(pTVar1->value_).gc);
      return lVar2;
    }
  }
  else if ((bVar3 == 7) || (bVar3 == 0x14)) {
    lVar2 = *(lua_Unsigned *)((pTVar1->value_).f + 0x10);
  }
  return lVar2;
}

Assistant:

LUA_API lua_Unsigned lua_rawlen (lua_State *L, int idx) {
  const TValue *o = index2value(L, idx);
  switch (ttypetag(o)) {
    case LUA_VSHRSTR: return cast(lua_Unsigned, tsvalue(o)->shrlen);
    case LUA_VLNGSTR: return cast(lua_Unsigned, tsvalue(o)->u.lnglen);
    case LUA_VUSERDATA: return cast(lua_Unsigned, uvalue(o)->len);
    case LUA_VTABLE: return luaH_getn(hvalue(o));
    default: return 0;
  }
}